

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool wabt::anon_unknown_1::IsModuleField(TokenTypePair pair)

{
  if (pair._M_elems[0] == Lpar) {
    if (((pair._M_elems[1] < I8X16) &&
        ((0x5400086342000U >> ((ulong)pair._M_elems >> 0x20 & 0x3f) & 1) != 0)) ||
       (pair._M_elems[1] == First_RefKind)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsModuleField(TokenTypePair pair) {
  if (pair[0] != TokenType::Lpar) {
    return false;
  }

  switch (pair[1]) {
    case TokenType::Data:
    case TokenType::Elem:
    case TokenType::Tag:
    case TokenType::Export:
    case TokenType::Func:
    case TokenType::Type:
    case TokenType::Global:
    case TokenType::Import:
    case TokenType::Memory:
    case TokenType::Start:
    case TokenType::Table:
      return true;
    default:
      return false;
  }
}